

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O0

int GetDataBlock(gdIOCtx *fd,uchar *buf,int *ZeroDataBlockP)

{
  int iVar1;
  int i;
  int rv;
  int *ZeroDataBlockP_local;
  uchar *buf_local;
  gdIOCtx *fd_local;
  
  iVar1 = GetDataBlock_(fd,buf,ZeroDataBlockP);
  return iVar1;
}

Assistant:

static int
GetDataBlock(gdIOCtx *fd, unsigned char *buf, int *ZeroDataBlockP)
{
	int rv, i;

	rv = GetDataBlock_(fd,buf, ZeroDataBlockP);

	if(VERBOSE) {
		printf("[GetDataBlock returning %d",rv);
		if(rv > 0) {
			printf(":");
			for(i = 0; i < rv; i++) {
				printf(" %02x",buf[i]);
			}
		}
		printf("]\n");
	}

	return rv;
}